

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom
          (DecorationManager *this,uint32_t id,
          function<bool_(const_spvtools::opt::Instruction_&)> *pred)

{
  Op OVar1;
  undefined8 *puVar2;
  _func_int **pp_Var3;
  iterator iVar4;
  IRContext *pIVar5;
  DecorationManager *pDVar6;
  bool bVar7;
  _Type acVar8;
  iterator iVar9;
  undefined8 *puVar10;
  Operand *pOVar11;
  Operand *pOVar12;
  pointer pOVar13;
  Instruction *node;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  __hash_code __code;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  byte bVar20;
  int iVar21;
  uint uVar22;
  undefined8 *puVar23;
  ulong *puVar24;
  uint index;
  uint32_t index_00;
  ulong *puVar25;
  _func_int *p_Var26;
  _func_int *p_Var27;
  undefined7 uVar28;
  OperandData *that;
  iterator __begin2;
  Instruction **ppIVar29;
  iterator __end2;
  ulong *puVar30;
  iterator iVar31;
  bool bVar32;
  Instruction *inst_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> insts_to_kill;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  group_decorations_to_keep;
  uint32_t group_id;
  Instruction *decoration;
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  indirect_decorations_to_remove;
  Instruction *local_128;
  uint local_120;
  array<signed_char,_4UL> local_11c;
  Instruction **local_118;
  iterator iStack_110;
  Instruction **local_108;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_f8;
  IRContext *local_f0;
  Instruction **local_e8;
  iterator iStack_e0;
  Instruction **local_d8;
  ulong *local_c8;
  int local_bc;
  uint32_t local_b8;
  uint32_t local_b4;
  undefined1 local_b0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_90;
  undefined1 local_88 [56];
  long local_50;
  long local_48;
  DecorationManager *local_40;
  ulong *local_38;
  
  local_11c._M_elems = (_Type)id;
  local_f8._M_cur =
       (__node_type *)
       std::
       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)this,(key_type_conflict *)&local_11c);
  if (local_f8._M_cur == (__node_type *)0x0) {
    return false;
  }
  local_f0 = this->module_->context_;
  local_118 = (Instruction **)0x0;
  iStack_110._M_current = (Instruction **)0x0;
  local_108 = (Instruction **)0x0;
  local_48 = *(long *)((long)local_f8._M_cur + 0x40);
  local_50 = *(long *)((long)local_f8._M_cur + 0x48);
  puVar10 = *(undefined8 **)((long)local_f8._M_cur + 0x10);
  puVar2 = *(undefined8 **)((long)local_f8._M_cur + 0x18);
  if (puVar10 != puVar2) {
    do {
      local_88._0_8_ = *puVar10;
      if ((pred->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_005525b9:
        std::__throw_bad_function_call();
      }
      bVar7 = (*pred->_M_invoker)((_Any_data *)pred,(Instruction *)local_88._0_8_);
      if (bVar7) {
        if (iStack_110._M_current == local_108) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_118,iStack_110,(Instruction **)local_88);
        }
        else {
          *iStack_110._M_current = (Instruction *)local_88._0_8_;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar2);
  }
  local_88._0_8_ = local_88 + 0x30;
  local_88._8_8_ = 1;
  local_88._16_8_ = (_Hash_node_base *)0x0;
  local_88._24_8_ = 0;
  local_88._32_4_ = 1.0;
  local_88._40_8_ = 0;
  local_88._48_8_ = (__node_base_ptr)0x0;
  puVar24 = *(ulong **)
             ((long)&((local_f8._M_cur)->
                     super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                     ._M_storage._M_storage + 0x20);
  puVar30 = *(ulong **)
             ((long)&((local_f8._M_cur)->
                     super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                     ._M_storage._M_storage + 0x28);
  that = (OperandData *)0x0;
  pDVar6 = this;
  if (puVar24 != puVar30) {
    do {
      local_38 = puVar30;
      local_40 = pDVar6;
      local_128 = (Instruction *)*puVar24;
      if ((local_128->opcode_ & ~OpUndef) != OpGroupDecorate) {
        __assert_fail("inst->opcode() == spv::Op::OpGroupDecorate || inst->opcode() == spv::Op::OpGroupMemberDecorate"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x4f,
                      "bool spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(uint32_t, std::function<bool (const Instruction &)>)"
                     );
      }
      local_e8 = (Instruction **)0x0;
      iStack_e0._M_current = (Instruction **)0x0;
      local_d8 = (Instruction **)0x0;
      index_00 = (local_128->has_result_id_ & 1) + 1;
      if (local_128->has_type_id_ == false) {
        index_00 = (uint)local_128->has_result_id_;
      }
      local_c8 = puVar24;
      local_b4 = Instruction::GetSingleWordOperand(local_128,index_00);
      iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this,&local_b4);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
          ._M_cur == (__node_type *)0x0) {
        __assert_fail("group_iter != id_to_decoration_insts_.end() && \"Unknown decoration group\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x55,
                      "bool spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(uint32_t, std::function<bool (const Instruction &)>)"
                     );
      }
      puVar10 = *(undefined8 **)
                 ((long)iVar9.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ._M_cur + 0x10);
      puVar2 = *(undefined8 **)
                ((long)iVar9.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ._M_cur + 0x18);
      puVar23 = puVar10;
      if (puVar10 != puVar2) {
        do {
          local_b0._0_8_ = *puVar10;
          if ((pred->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005525b9;
          bVar7 = (*pred->_M_invoker)((_Any_data *)pred,(Instruction *)local_b0._0_8_);
          if (!bVar7) {
            if (iStack_e0._M_current == local_d8) {
              std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
              _M_realloc_insert<spvtools::opt::Instruction*const&>
                        ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                          *)&local_e8,iStack_e0,(Instruction **)local_b0);
            }
            else {
              *iStack_e0._M_current = (Instruction *)local_b0._0_8_;
              iStack_e0._M_current = iStack_e0._M_current + 1;
            }
          }
          puVar10 = puVar10 + 1;
        } while (puVar10 != puVar2);
        puVar23 = *(undefined8 **)
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ._M_cur + 0x10);
        puVar10 = *(undefined8 **)
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ._M_cur + 0x18);
      }
      if ((puVar10 == puVar23) ||
         ((long)iStack_e0._M_current - (long)local_e8 != (long)puVar10 - (long)puVar23)) {
        OVar1 = local_128->opcode_;
        uVar22 = (local_128->has_result_id_ & 1) + 1;
        if (local_128->has_type_id_ == false) {
          uVar22 = (uint)local_128->has_result_id_;
        }
        uVar16 = (int)((ulong)((long)(local_128->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_128->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                 uVar22;
        if (1 < uVar16) {
          iVar21 = (OVar1 != OpGroupDecorate) + 1;
          local_120 = OVar1 == OpGroupDecorate | 0xfffffffe;
          index = 1;
          local_bc = iVar21;
          do {
            acVar8 = (_Type)Instruction::GetSingleWordOperand(local_128,uVar22 + index);
            if (acVar8 == local_11c._M_elems) {
              local_b8 = index + 1;
              uVar22 = local_120;
              do {
                pOVar13 = (local_128->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar20 = local_128->has_type_id_;
                bVar17 = local_128->has_result_id_;
                uVar16 = (bVar17 & 1) + 1;
                if ((bool)bVar20 == false) {
                  uVar16 = (uint)bVar17;
                }
                uVar16 = ((int)((ulong)((long)(local_128->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pOVar13) >> 4) * -0x55555555 + uVar22) - uVar16;
                if (index < uVar16) {
                  pOVar11 = Instruction::GetInOperand(local_128,uVar16);
                  pOVar12 = Instruction::GetInOperand(local_128,index);
                  pOVar12->type = pOVar11->type;
                  that = &pOVar11->words;
                  utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar12->words,that);
                  if (OVar1 != OpGroupDecorate) {
                    pOVar11 = Instruction::GetInOperand(local_128,uVar16 + 1);
                    pOVar12 = Instruction::GetInOperand(local_128,local_b8);
                    uVar22 = local_120;
                    pOVar12->type = pOVar11->type;
                    utils::SmallVector<unsigned_int,_2UL>::operator=
                              (&pOVar12->words,&pOVar11->words);
                    pOVar13 = (local_128->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    bVar20 = local_128->has_type_id_;
                    bVar17 = local_128->has_result_id_;
LAB_00551e37:
                    that = (OperandData *)(ulong)(uVar16 + 1);
                    uVar18 = (bVar17 & 1) + 1;
                    if ((bVar20 & 1) == 0) {
                      uVar18 = (uint)bVar17;
                    }
                    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                    _M_erase(&local_128->operands_,
                             (Operand *)
                             ((long)(pOVar13[(long)that].words.buffer + -6) + (ulong)(uVar18 * 0x30)
                             ));
                  }
                }
                else if (OVar1 != OpGroupDecorate) goto LAB_00551e37;
                uVar18 = (local_128->has_result_id_ & 1) + 1;
                if (local_128->has_type_id_ == false) {
                  uVar18 = (uint)local_128->has_result_id_;
                }
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                _M_erase(&local_128->operands_,
                         (Operand *)
                         ((long)((local_128->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar16].words.buffer + -6
                                ) + (ulong)(uVar18 * 0x30)));
                uVar18 = (local_128->has_result_id_ & 1) + 1;
                if (local_128->has_type_id_ == false) {
                  uVar18 = (uint)local_128->has_result_id_;
                }
                uVar16 = (int)((ulong)((long)(local_128->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_128->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar18;
                uVar28 = (undefined7)((ulong)that >> 8);
                if (uVar16 <= index) {
                  that = (OperandData *)CONCAT71(uVar28,1);
                  goto LAB_00551f27;
                }
                acVar8 = (_Type)Instruction::GetSingleWordOperand(local_128,uVar18 + index);
              } while (acVar8 == local_11c._M_elems);
              that = (OperandData *)CONCAT71(uVar28,1);
              iVar21 = local_bc;
            }
            index = index + iVar21;
            uVar22 = (local_128->has_result_id_ & 1) + 1;
            if (local_128->has_type_id_ == false) {
              uVar22 = (uint)local_128->has_result_id_;
            }
            uVar16 = (int)((ulong)((long)(local_128->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_128->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar22;
          } while (index < uVar16);
        }
LAB_00551f27:
        this = local_40;
        pIVar5 = local_f0;
        if (uVar16 == 1) {
          std::
          _Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<spvtools::opt::Instruction*&>
                    ((_Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_88,&local_128);
          if (iStack_110._M_current == local_108) {
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            _M_realloc_insert<spvtools::opt::Instruction*const&>
                      ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                        *)&local_118,iStack_110,&local_128);
          }
          else {
            *iStack_110._M_current = local_128;
            iStack_110._M_current = iStack_110._M_current + 1;
          }
        }
        else if (((ulong)that & 1) != 0) {
          IRContext::ForgetUses(local_f0,local_128);
          std::
          _Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<spvtools::opt::Instruction*&>
                    ((_Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_88,&local_128);
          IRContext::AnalyzeUses(pIVar5,local_128);
        }
        iVar4._M_current = iStack_e0._M_current;
        if (local_e8 != iStack_e0._M_current) {
          local_120 = (uint)that;
          ppIVar29 = local_e8;
          do {
            node = Instruction::Clone(*ppIVar29,this->module_->context_);
            local_b0._0_8_ = &PTR__SmallVector_00b02ef8;
            local_b0._24_8_ = local_b0 + 0x10;
            local_90._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_b0[0x10] = local_11c._M_elems[0];
            local_b0[0x11] = local_11c._M_elems[1];
            local_b0[0x12] = local_11c._M_elems[2];
            local_b0[0x13] = local_11c._M_elems[3];
            local_b0._8_8_ = 1;
            uVar14 = (ulong)(node->has_result_id_ & 1) + 1;
            if (node->has_type_id_ == false) {
              uVar14 = (ulong)node->has_result_id_;
            }
            pOVar13 = (node->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar19 = ((long)(node->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar13 >> 4) *
                     -0x5555555555555555;
            if (uVar19 < uVar14 || uVar19 - uVar14 == 0) {
              __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2b8,
                            "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                           );
            }
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)
                       ((long)&((OperandData *)((pOVar13->words).buffer + -4))->_vptr_SmallVector +
                       (ulong)(uint)((int)uVar14 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_b0
                      );
            local_b0._0_8_ = &PTR__SmallVector_00b02ef8;
            if (local_90._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_90,local_90._M_head_impl);
            }
            utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                      (&(this->module_->annotations_).
                        super_IntrusiveList<spvtools::opt::Instruction>,node);
            IRContext::AnalyzeUses
                      (local_f0,(this->module_->annotations_).
                                super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                                super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
            ppIVar29 = ppIVar29 + 1;
          } while (ppIVar29 != iVar4._M_current);
          that = (OperandData *)(ulong)local_120;
        }
      }
      puVar24 = local_c8;
      if (local_e8 != (Instruction **)0x0) {
        operator_delete(local_e8,(long)local_d8 - (long)local_e8);
      }
      puVar24 = puVar24 + 1;
      pDVar6 = local_40;
      puVar30 = local_38;
    } while (puVar24 != local_38);
    puVar24 = *(ulong **)
               ((long)&((local_f8._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x20);
    puVar30 = *(ulong **)
               ((long)&((local_f8._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x28);
    that = (OperandData *)(ulong)((byte)that & 1);
  }
  pIVar5 = local_f0;
  iVar4._M_current = iStack_110._M_current;
  uVar14 = (long)puVar30 - (long)puVar24;
  if (0 < (long)uVar14 >> 5) {
    puVar25 = (ulong *)((long)puVar24 + (uVar14 & 0xffffffffffffffe0));
    lVar15 = (long)uVar14 >> 5;
    do {
      uVar14 = *puVar24 % (ulong)local_88._8_8_;
      pp_Var3 = (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->
                  _vptr_IntrusiveNodeBase)[uVar14];
      if (pp_Var3 != (_func_int **)0x0) {
        p_Var27 = *pp_Var3;
        uVar19 = *(ulong *)(p_Var27 + 8);
        do {
          if (*puVar24 == uVar19) goto LAB_005523da;
          p_Var27 = *(_func_int **)p_Var27;
        } while ((p_Var27 != (_func_int *)0x0) &&
                (uVar19 = *(ulong *)(p_Var27 + 8), uVar19 % (ulong)local_88._8_8_ == uVar14));
      }
      uVar14 = puVar24[1] % (ulong)local_88._8_8_;
      pp_Var3 = (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->
                  _vptr_IntrusiveNodeBase)[uVar14];
      if (pp_Var3 != (_func_int **)0x0) {
        p_Var27 = *pp_Var3;
        uVar19 = *(ulong *)(p_Var27 + 8);
        do {
          if (puVar24[1] == uVar19) {
            puVar24 = puVar24 + 1;
            goto LAB_005523da;
          }
          p_Var27 = *(_func_int **)p_Var27;
        } while ((p_Var27 != (_func_int *)0x0) &&
                (uVar19 = *(ulong *)(p_Var27 + 8), uVar19 % (ulong)local_88._8_8_ == uVar14));
      }
      uVar14 = puVar24[2] % (ulong)local_88._8_8_;
      pp_Var3 = (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->
                  _vptr_IntrusiveNodeBase)[uVar14];
      if (pp_Var3 != (_func_int **)0x0) {
        p_Var27 = *pp_Var3;
        uVar19 = *(ulong *)(p_Var27 + 8);
        do {
          if (puVar24[2] == uVar19) {
            puVar24 = puVar24 + 2;
            goto LAB_005523da;
          }
          p_Var27 = *(_func_int **)p_Var27;
        } while ((p_Var27 != (_func_int *)0x0) &&
                (uVar19 = *(ulong *)(p_Var27 + 8), uVar19 % (ulong)local_88._8_8_ == uVar14));
      }
      uVar14 = puVar24[3] % (ulong)local_88._8_8_;
      pp_Var3 = (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->
                  _vptr_IntrusiveNodeBase)[uVar14];
      if (pp_Var3 != (_func_int **)0x0) {
        p_Var27 = *pp_Var3;
        uVar19 = *(ulong *)(p_Var27 + 8);
        do {
          if (puVar24[3] == uVar19) {
            puVar24 = puVar24 + 3;
            goto LAB_005523da;
          }
          p_Var27 = *(_func_int **)p_Var27;
        } while ((p_Var27 != (_func_int *)0x0) &&
                (uVar19 = *(ulong *)(p_Var27 + 8), uVar19 % (ulong)local_88._8_8_ == uVar14));
      }
      puVar24 = puVar24 + 4;
      bVar7 = 1 < lVar15;
      lVar15 = lVar15 + -1;
    } while (bVar7);
    uVar14 = (long)puVar30 - (long)puVar25;
    puVar24 = puVar25;
  }
  lVar15 = (long)uVar14 >> 3;
  if (lVar15 == 3) {
    uVar14 = *puVar24 % (ulong)local_88._8_8_;
    pp_Var3 = (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->
                _vptr_IntrusiveNodeBase)[uVar14];
    if (pp_Var3 != (_func_int **)0x0) {
      p_Var27 = *pp_Var3;
      uVar19 = *(ulong *)(p_Var27 + 8);
      do {
        if (*puVar24 == uVar19) goto LAB_005523da;
        p_Var27 = *(_func_int **)p_Var27;
      } while ((p_Var27 != (_func_int *)0x0) &&
              (uVar19 = *(ulong *)(p_Var27 + 8), uVar19 % (ulong)local_88._8_8_ == uVar14));
    }
    puVar24 = puVar24 + 1;
LAB_00552334:
    uVar14 = *puVar24 % (ulong)local_88._8_8_;
    pp_Var3 = (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->
                _vptr_IntrusiveNodeBase)[uVar14];
    if (pp_Var3 != (_func_int **)0x0) {
      p_Var27 = *pp_Var3;
      uVar19 = *(ulong *)(p_Var27 + 8);
      do {
        if (*puVar24 == uVar19) goto LAB_005523da;
        p_Var27 = *(_func_int **)p_Var27;
      } while ((p_Var27 != (_func_int *)0x0) &&
              (uVar19 = *(ulong *)(p_Var27 + 8), uVar19 % (ulong)local_88._8_8_ == uVar14));
    }
    puVar24 = puVar24 + 1;
  }
  else {
    if (lVar15 == 2) goto LAB_00552334;
    if (lVar15 != 1) goto LAB_0055244f;
  }
  uVar14 = *puVar24;
  pp_Var3 = (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->
              _vptr_IntrusiveNodeBase)[uVar14 % (ulong)local_88._8_8_];
  p_Var27 = (_func_int *)0x0;
  if ((pp_Var3 != (_func_int **)0x0) &&
     (p_Var26 = *pp_Var3, p_Var27 = p_Var26, uVar14 != *(ulong *)(p_Var26 + 8))) {
    while (p_Var26 = *(_func_int **)p_Var26, p_Var26 != (_func_int *)0x0) {
      p_Var27 = (_func_int *)0x0;
      if ((*(ulong *)(p_Var26 + 8) % (ulong)local_88._8_8_ != uVar14 % (ulong)local_88._8_8_) ||
         (p_Var27 = p_Var26, uVar14 == *(ulong *)(p_Var26 + 8))) goto LAB_005523d0;
    }
    p_Var27 = (_func_int *)0x0;
  }
LAB_005523d0:
  if (p_Var27 == (_func_int *)0x0) {
    puVar24 = puVar30;
  }
LAB_005523da:
  if ((puVar24 != puVar30) && (puVar25 = puVar24 + 1, puVar25 != puVar30)) {
    do {
      uVar14 = *puVar25;
      pp_Var3 = (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->
                  _vptr_IntrusiveNodeBase)[uVar14 % (ulong)local_88._8_8_];
      if (pp_Var3 != (_func_int **)0x0) {
        p_Var27 = *pp_Var3;
        uVar19 = *(ulong *)(p_Var27 + 8);
        do {
          if (uVar14 == uVar19) goto LAB_00552439;
          p_Var27 = *(_func_int **)p_Var27;
        } while ((p_Var27 != (_func_int *)0x0) &&
                (uVar19 = *(ulong *)(p_Var27 + 8),
                uVar19 % (ulong)local_88._8_8_ == uVar14 % (ulong)local_88._8_8_));
      }
      *puVar24 = uVar14;
      puVar24 = puVar24 + 1;
LAB_00552439:
      puVar25 = puVar25 + 1;
    } while (puVar25 != puVar30);
    puVar30 = *(ulong **)
               ((long)&((local_f8._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x28);
  }
  if (puVar24 != puVar30) {
    *(ulong **)
     ((long)&((local_f8._M_cur)->
             super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
             ).
             super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
             ._M_storage._M_storage + 0x28) = puVar24;
  }
LAB_0055244f:
  local_120 = CONCAT31(local_120._1_3_,local_118 != iStack_110._M_current);
  ppIVar29 = local_118;
  iVar31._M_current = local_118;
  if (local_118 != iStack_110._M_current) {
    do {
      IRContext::KillInst(pIVar5,*ppIVar29);
      ppIVar29 = ppIVar29 + 1;
    } while (ppIVar29 != iVar4._M_current);
    iVar31._M_current = iStack_110._M_current;
    if (iStack_110._M_current != local_118) {
      iStack_110._M_current = local_118;
      iVar31._M_current = local_118;
    }
  }
  if (((local_48 != local_50) &&
      (*(long *)((long)&((local_f8._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                        ._M_storage._M_storage + 8) ==
       *(long *)((long)&((local_f8._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                        ._M_storage._M_storage + 0x10))) &&
     (*(long *)((long)&((local_f8._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x20) ==
      *(long *)((long)&((local_f8._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x28))) {
    puVar10 = *(undefined8 **)
               ((long)&((local_f8._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x38);
    puVar2 = *(undefined8 **)
              ((long)&((local_f8._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                      ._M_storage._M_storage + 0x40);
    if (puVar10 != puVar2) {
      do {
        local_b0._0_8_ = *puVar10;
        if (iStack_110._M_current == local_108) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_118,iStack_110,(Instruction **)local_b0);
        }
        else {
          *iStack_110._M_current = (Instruction *)local_b0._0_8_;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
        puVar10 = puVar10 + 1;
        iVar31._M_current = iStack_110._M_current;
      } while (puVar10 != puVar2);
    }
  }
  pIVar5 = local_f0;
  bVar32 = local_118 != iVar31._M_current;
  bVar7 = bVar32;
  ppIVar29 = local_118;
  while (bVar7) {
    IRContext::KillInst(pIVar5,*ppIVar29);
    ppIVar29 = ppIVar29 + 1;
    bVar7 = ppIVar29 != iVar31._M_current;
  }
  if (((*(long *)((long)local_f8._M_cur + 0x10) == *(long *)((long)local_f8._M_cur + 0x18)) &&
      (*(long *)((long)local_f8._M_cur + 0x28) == *(long *)((long)local_f8._M_cur + 0x30))) &&
     (*(long *)((long)local_f8._M_cur + 0x40) == *(long *)((long)local_f8._M_cur + 0x48))) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)this,(const_iterator)local_f8._M_cur);
  }
  bVar20 = (byte)that | (byte)local_120;
  std::
  _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_88);
  if (local_118 != (Instruction **)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  return (bool)(bVar20 | bVar32);
}

Assistant:

bool DecorationManager::RemoveDecorationsFrom(
    uint32_t id, std::function<bool(const Instruction&)> pred) {
  bool was_modified = false;
  const auto ids_iter = id_to_decoration_insts_.find(id);
  if (ids_iter == id_to_decoration_insts_.end()) {
    return was_modified;
  }

  TargetData& decorations_info = ids_iter->second;
  auto context = module_->context();
  std::vector<Instruction*> insts_to_kill;
  const bool is_group = !decorations_info.decorate_insts.empty();

  // Schedule all direct decorations for removal if instructed as such by
  // |pred|.
  for (Instruction* inst : decorations_info.direct_decorations)
    if (pred(*inst)) insts_to_kill.push_back(inst);

  // For all groups being directly applied to |id|, remove |id| (and the
  // literal if |inst| is an OpGroupMemberDecorate) from the instruction
  // applying the group.
  std::unordered_set<const Instruction*> indirect_decorations_to_remove;
  for (Instruction* inst : decorations_info.indirect_decorations) {
    assert(inst->opcode() == spv::Op::OpGroupDecorate ||
           inst->opcode() == spv::Op::OpGroupMemberDecorate);

    std::vector<Instruction*> group_decorations_to_keep;
    const uint32_t group_id = inst->GetSingleWordInOperand(0u);
    const auto group_iter = id_to_decoration_insts_.find(group_id);
    assert(group_iter != id_to_decoration_insts_.end() &&
           "Unknown decoration group");
    const auto& group_decorations = group_iter->second.direct_decorations;
    for (Instruction* decoration : group_decorations) {
      if (!pred(*decoration)) group_decorations_to_keep.push_back(decoration);
    }

    // If all decorations should be kept, then we can keep |id| part of the
    // group.  However, if the group itself has no decorations, we should remove
    // the id from the group.  This is needed to make |KillNameAndDecorate| work
    // correctly when a decoration group has no decorations.
    if (group_decorations_to_keep.size() == group_decorations.size() &&
        group_decorations.size() != 0) {
      continue;
    }

    // Otherwise, remove |id| from the targets of |group_id|
    const uint32_t stride =
        inst->opcode() == spv::Op::OpGroupDecorate ? 1u : 2u;
    for (uint32_t i = 1u; i < inst->NumInOperands();) {
      if (inst->GetSingleWordInOperand(i) != id) {
        i += stride;
        continue;
      }

      const uint32_t last_operand_index = inst->NumInOperands() - stride;
      if (i < last_operand_index)
        inst->GetInOperand(i) = inst->GetInOperand(last_operand_index);
      // Remove the associated literal, if it exists.
      if (stride == 2u) {
        if (i < last_operand_index)
          inst->GetInOperand(i + 1u) =
              inst->GetInOperand(last_operand_index + 1u);
        inst->RemoveInOperand(last_operand_index + 1u);
      }
      inst->RemoveInOperand(last_operand_index);
      was_modified = true;
    }

    // If the instruction has no targets left, remove the instruction
    // altogether.
    if (inst->NumInOperands() == 1u) {
      indirect_decorations_to_remove.emplace(inst);
      insts_to_kill.push_back(inst);
    } else if (was_modified) {
      context->ForgetUses(inst);
      indirect_decorations_to_remove.emplace(inst);
      context->AnalyzeUses(inst);
    }

    // If only some of the decorations should be kept, clone them and apply
    // them directly to |id|.
    if (!group_decorations_to_keep.empty()) {
      for (Instruction* decoration : group_decorations_to_keep) {
        // simply clone decoration and change |group_id| to |id|
        std::unique_ptr<Instruction> new_inst(
            decoration->Clone(module_->context()));
        new_inst->SetInOperand(0, {id});
        module_->AddAnnotationInst(std::move(new_inst));
        auto decoration_iter = --module_->annotation_end();
        context->AnalyzeUses(&*decoration_iter);
      }
    }
  }

  auto& indirect_decorations = decorations_info.indirect_decorations;
  indirect_decorations.erase(
      std::remove_if(
          indirect_decorations.begin(), indirect_decorations.end(),
          [&indirect_decorations_to_remove](const Instruction* inst) {
            return indirect_decorations_to_remove.count(inst);
          }),
      indirect_decorations.end());

  was_modified |= !insts_to_kill.empty();
  for (Instruction* inst : insts_to_kill) context->KillInst(inst);
  insts_to_kill.clear();

  // Schedule all instructions applying the group for removal if this group no
  // longer applies decorations, either directly or indirectly.
  if (is_group && decorations_info.direct_decorations.empty() &&
      decorations_info.indirect_decorations.empty()) {
    for (Instruction* inst : decorations_info.decorate_insts)
      insts_to_kill.push_back(inst);
  }
  was_modified |= !insts_to_kill.empty();
  for (Instruction* inst : insts_to_kill) context->KillInst(inst);

  if (decorations_info.direct_decorations.empty() &&
      decorations_info.indirect_decorations.empty() &&
      decorations_info.decorate_insts.empty()) {
    id_to_decoration_insts_.erase(ids_iter);
  }
  return was_modified;
}